

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O1

void __thiscall HighsIis::addRow(HighsIis *this,HighsInt row,HighsInt status)

{
  iterator iVar1;
  int local_10;
  HighsInt local_c;
  
  iVar1._M_current =
       (this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_10 = status;
  local_c = row;
  if (iVar1._M_current ==
      (this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->row_index_,iVar1,&local_c);
  }
  else {
    *iVar1._M_current = row;
    (this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->row_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->row_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->row_bound_,iVar1,&local_10);
  }
  else {
    *iVar1._M_current = local_10;
    (this->row_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = iVar1._M_current + 1;
  }
  return;
}

Assistant:

void HighsIis::addRow(const HighsInt row, const HighsInt status) {
  this->row_index_.push_back(row);
  this->row_bound_.push_back(status);
}